

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.c
# Opt level: O0

int default_stream_scheduler_do_send
              (quicly_stream_scheduler_t *self,quicly_conn_t *conn,quicly_send_context_t *s)

{
  int iVar1;
  int iVar2;
  int iVar3;
  quicly_send_context_t *in_RDX;
  quicly_conn_t *in_RSI;
  quicly_stream_t *stream;
  int ret;
  int conn_is_blocked;
  st_quicly_default_scheduler_state_t *sched;
  quicly_send_context_t *in_stack_00000050;
  quicly_stream_t *in_stack_00000058;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  undefined1 uVar4;
  quicly_linklist_t *in_stack_ffffffffffffffd0;
  st_quicly_linklist_t *prev;
  int iVar5;
  st_quicly_default_scheduler_state_t *sched_00;
  
  sched_00 = &(in_RSI->super)._default_scheduler;
  iVar1 = quicly_is_blocked(in_RSI);
  iVar5 = 0;
  if (iVar1 == 0) {
    quicly_linklist_insert_list
              (in_stack_ffffffffffffffd0,
               (quicly_linklist_t *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  }
  while( true ) {
    iVar2 = quicly_can_send_data(in_RSI,in_RDX);
    uVar4 = false;
    if (iVar2 != 0) {
      iVar2 = quicly_linklist_is_linked(&sched_00->active);
      uVar4 = iVar2 != 0;
    }
    if ((bool)uVar4 == false) break;
    prev = (sched_00->active).next + -0x11;
    quicly_linklist_unlink((quicly_linklist_t *)0x12d1cf);
    if ((iVar1 == 0) ||
       (iVar2 = quicly_stream_can_send
                          ((quicly_stream_t *)CONCAT44(iVar1,iVar5),(int)((ulong)prev >> 0x20)),
       iVar2 != 0)) {
      iVar2 = (int)((ulong)prev >> 0x20);
      iVar5 = quicly_send_stream(in_stack_00000058,in_stack_00000050);
      if (iVar5 != 0) {
        if (iVar5 == 0xff02) {
          iVar3 = quicly_stream_can_send((quicly_stream_t *)CONCAT44(iVar1,0xff02),iVar2);
          if (iVar3 == 0) {
            __assert_fail("quicly_stream_can_send(stream, 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/defaults.c"
                          ,0x137,
                          "int default_stream_scheduler_do_send(quicly_stream_scheduler_t *, quicly_conn_t *, quicly_send_context_t *)"
                         );
          }
          link_stream(sched_00,(quicly_stream_t *)CONCAT44(iVar1,iVar5),iVar2);
        }
        return iVar5;
      }
      iVar1 = quicly_is_blocked(in_RSI);
      iVar3 = quicly_stream_can_send((quicly_stream_t *)CONCAT44(iVar1,iVar5),iVar2);
      if (iVar3 != 0) {
        link_stream(sched_00,(quicly_stream_t *)CONCAT44(iVar1,iVar5),iVar2);
      }
    }
    else {
      quicly_linklist_insert(prev,(quicly_linklist_t *)CONCAT17(uVar4,in_stack_ffffffffffffffc8));
    }
  }
  return iVar5;
}

Assistant:

static int default_stream_scheduler_do_send(quicly_stream_scheduler_t *self, quicly_conn_t *conn, quicly_send_context_t *s)
{
    struct st_quicly_default_scheduler_state_t *sched = &((struct _st_quicly_conn_public_t *)conn)->_default_scheduler;
    int conn_is_blocked = quicly_is_blocked(conn), ret = 0;

    if (!conn_is_blocked)
        quicly_linklist_insert_list(&sched->active, &sched->blocked);

    while (quicly_can_send_data((quicly_conn_t *)conn, s) && quicly_linklist_is_linked(&sched->active)) {
        /* detach the first active stream */
        quicly_stream_t *stream =
            (void *)((char *)sched->active.next - offsetof(quicly_stream_t, _send_aux.pending_link.default_scheduler));
        quicly_linklist_unlink(&stream->_send_aux.pending_link.default_scheduler);
        /* relink the stream to the blocked list if necessary */
        if (conn_is_blocked && !quicly_stream_can_send(stream, 0)) {
            quicly_linklist_insert(sched->blocked.prev, &stream->_send_aux.pending_link.default_scheduler);
            continue;
        }
        /* send! */
        if ((ret = quicly_send_stream(stream, s)) != 0) {
            /* FIXME Stop quicly_send_stream emitting SENDBUF_FULL (happpens when CWND is congested). Otherwise, we need to make
             * adjustments to the scheduler after popping a stream */
            if (ret == QUICLY_ERROR_SENDBUF_FULL) {
                assert(quicly_stream_can_send(stream, 1));
                link_stream(sched, stream, conn_is_blocked);
            }
            break;
        }
        /* reschedule */
        conn_is_blocked = quicly_is_blocked(conn);
        if (quicly_stream_can_send(stream, 1))
            link_stream(sched, stream, conn_is_blocked);
    }

    return ret;
}